

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  lu_byte lVar1;
  ravi_type_map rVar2;
  uint uVar3;
  OpCode OVar4;
  uint uVar5;
  int iVar6;
  OpCode OVar7;
  char *format;
  
  switch(e->k) {
  case VLOCAL:
    e->k = VNONRELOC;
    if (((byte)ravi_parser_debug & 1) != 0) {
      format = "luaK_dischargevars (VLOCAL->VNONRELOC) %e\n";
LAB_00140f1e:
      raviY_printf(fs,format,e);
      return;
    }
    break;
  case VUPVAL:
    iVar6 = luaK_codeABC(fs,OP_GETUPVAL,0,(e->u).info,0);
    (e->u).info = iVar6;
    e->k = VRELOCABLE;
    if (((byte)ravi_parser_debug & 1) != 0) {
      format = "luaK_dischargevars (VUPVAL->VRELOCABLE) %e\n";
      goto LAB_00140f1e;
    }
    break;
  case VINDEXED:
    freereg(fs,(int)(e->u).ind.idx);
    lVar1 = (e->u).ind.vt;
    if (lVar1 == '\t') {
      if (((e->u).ind.key_ravi_type_map == 0x100) &&
         (iVar6 = isshortstr(fs,(int)(e->u).ind.idx), iVar6 != 0)) {
        OVar7 = OP_RAVI_GETTABUP_SK;
      }
      else {
        OVar7 = OP_GETTABUP;
      }
    }
    else {
      if (lVar1 != '\b') {
        __assert_fail("e->u.ind.vt == VUPVAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x26a,"void luaK_dischargevars(FuncState *, expdesc *)");
      }
      freereg(fs,(uint)(e->u).ind.t);
      rVar2 = (e->u).ind.key_ravi_type_map;
      OVar7 = OP_GETTABLE;
      if (rVar2 == 0x100) {
        iVar6 = isshortstr(fs,(int)(e->u).ind.idx);
        if (iVar6 != 0) {
          OVar7 = (uint)(e->ravi_type_map != 0x80) * 5 + OP_RAVI_TABLE_GETFIELD;
        }
      }
      else if (rVar2 == 8) {
        OVar4 = OP_RAVI_GETI;
        if (e->ravi_type_map == 0x20) {
          OVar4 = OP_RAVI_IARRAY_GET;
        }
        OVar7 = OP_RAVI_FARRAY_GET;
        if (e->ravi_type_map != 0x40) {
          OVar7 = OVar4;
        }
      }
    }
    uVar3 = e->ravi_type_map;
    if ((uVar3 & 0xffffff9f) == 0) {
      uVar5 = uVar3 >> 2 | 0x10;
      if (uVar3 < 0x40) {
        uVar5 = uVar3 >> 2 & 8;
      }
    }
    else {
      uVar5 = 0xffffffff;
    }
    e->ravi_type_map = uVar5;
    iVar6 = luaK_codeABC(fs,OVar7,0,(uint)(e->u).ind.t,(int)(e->u).ind.idx);
    (e->u).info = iVar6;
    e->k = VRELOCABLE;
    if (((byte)ravi_parser_debug & 1) != 0) {
      format = "luaK_dischargevars (VINDEXED->VRELOCABLE) %e\n";
      goto LAB_00140f1e;
    }
    break;
  case VCALL:
  case VVARARG:
    luaK_setoneret(fs,e);
    return;
  }
  return;
}

Assistant:

void luaK_dischargevars (FuncState *fs, expdesc *e) {
  switch (e->k) {
    case VLOCAL: {  /* already in a register */
      e->k = VNONRELOC;  /* becomes a non-relocatable value */
      DEBUG_EXPR(raviY_printf(fs, "luaK_dischargevars (VLOCAL->VNONRELOC) %e\n", e));
      break;
    }
    case VUPVAL: {  /* move value to some (pending) register */
      e->u.info = luaK_codeABC(fs, OP_GETUPVAL, 0, e->u.info, 0);
      e->k = VRELOCABLE;
      DEBUG_EXPR(raviY_printf(fs, "luaK_dischargevars (VUPVAL->VRELOCABLE) %e\n", e));
      break;
    }
    case VINDEXED: {
      OpCode op;
      freereg(fs, e->u.ind.idx);
      if (e->u.ind.vt == VLOCAL) {  /* is 't' in a register? */
        freereg(fs, e->u.ind.t);
        /* TODO we should do this for upvalues too */
        /* table access - set specialized op codes if array types are detected */
        if (e->u.ind.key_ravi_type_map == RAVI_TM_INTEGER) {
          if (e->ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
            op = OP_RAVI_FARRAY_GET;
          } else if (e->ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
            op = OP_RAVI_IARRAY_GET;
          } else {
            op = OP_RAVI_GETI;
          }
        } else if (e->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, e->u.ind.idx)) {
          op = e->ravi_type_map == RAVI_TM_TABLE ? OP_RAVI_TABLE_GETFIELD : OP_RAVI_GETFIELD;
        } else {
          op = OP_GETTABLE;
        }
      }
      else {
        lua_assert(e->u.ind.vt == VUPVAL);
        if (e->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, e->u.ind.idx))
          op = OP_RAVI_GETTABUP_SK;
        else
          op = OP_GETTABUP;  /* 't' is in an upvalue */
      }
      ravi_type_map result_type = 0;
      if (e->ravi_type_map & (~(RAVI_TM_INTEGER_ARRAY | RAVI_TM_FLOAT_ARRAY))) {
        result_type = RAVI_TM_ANY;
      } else {
        if (e->ravi_type_map & RAVI_TM_INTEGER_ARRAY) result_type |= RAVI_TM_INTEGER;
        if (e->ravi_type_map & RAVI_TM_FLOAT_ARRAY) result_type |= RAVI_TM_FLOAT;
      }
      e->ravi_type_map = result_type;
      e->u.info = luaK_codeABC(fs, op, 0, e->u.ind.t, e->u.ind.idx);
      e->k = VRELOCABLE;
      DEBUG_EXPR(raviY_printf(fs, "luaK_dischargevars (VINDEXED->VRELOCABLE) %e\n", e));
      break;
    }
    case VVARARG: case VCALL: {
      luaK_setoneret(fs, e);
      break;
    }
    default: break;  /* there is one value available (somewhere) */
  }
}